

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void whereInfoFree(sqlite3 *db,WhereInfo *pWInfo)

{
  WhereLoop *p;
  ulong uVar1;
  WhereLoop **ppWVar2;
  
  ppWVar2 = &pWInfo->a[0].pWLoop;
  for (uVar1 = 0; uVar1 < pWInfo->nLevel; uVar1 = uVar1 + 1) {
    if ((*ppWVar2 != (WhereLoop *)0x0) && (((*ppWVar2)->wsFlags & 0x800) != 0)) {
      sqlite3DbFree(db,ppWVar2[-1]);
    }
    ppWVar2 = ppWVar2 + 0xb;
  }
  sqlite3WhereClauseClear(&pWInfo->sWC);
  while (p = pWInfo->pLoops, p != (WhereLoop *)0x0) {
    pWInfo->pLoops = p->pNextLoop;
    whereLoopDelete(db,p);
  }
  sqlite3DbFreeNN(db,pWInfo);
  return;
}

Assistant:

static void whereInfoFree(sqlite3 *db, WhereInfo *pWInfo){
  int i;
  assert( pWInfo!=0 );
  for(i=0; i<pWInfo->nLevel; i++){
    WhereLevel *pLevel = &pWInfo->a[i];
    if( pLevel->pWLoop && (pLevel->pWLoop->wsFlags & WHERE_IN_ABLE) ){
      sqlite3DbFree(db, pLevel->u.in.aInLoop);
    }
  }
  sqlite3WhereClauseClear(&pWInfo->sWC);
  while( pWInfo->pLoops ){
    WhereLoop *p = pWInfo->pLoops;
    pWInfo->pLoops = p->pNextLoop;
    whereLoopDelete(db, p);
  }
  sqlite3DbFreeNN(db, pWInfo);
}